

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::VarScope::merge(VarScope *this,VarScope *other)

{
  ValueRef *this_00;
  mapped_type pVVar1;
  iterator iVar2;
  mapped_type *ppVVar3;
  int iVar4;
  VarScope *pVVar5;
  VarScope *pVVar6;
  __node_base *p_Var7;
  
  pVVar5 = other;
  for (pVVar6 = this; pVVar6 != (VarScope *)0x0; pVVar6 = pVVar6->parent) {
    p_Var7 = &(pVVar5->symbols)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      iVar2 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pVVar6->symbols)._M_h,(key_type *)(p_Var7 + 1));
      this_00 = *(ValueRef **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
      if (iVar2.
          super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>.
          _M_cur == (__node_type *)0x0) {
        ValueRef::kill(this_00,5,1);
        pVVar1 = *(mapped_type *)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
        ppVVar3 = std::__detail::
                  _Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pVVar6->symbols,(key_type *)(p_Var7 + 1));
        *ppVVar3 = pVVar1;
      }
      else if (this_00->info ==
               (*(ValueRef **)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                        ._M_cur + 0x10))->info) {
        ValueRef::merge(*(ValueRef **)
                         ((long)iVar2.
                                super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                                ._M_cur + 0x10),this_00);
      }
    }
    pVVar5 = pVVar5->parent;
  }
  iVar4 = other->evalId;
  if (other->evalId < this->evalId) {
    iVar4 = this->evalId;
  }
  this->evalId = iVar4 + 1;
  return;
}

Assistant:

void VarScope::merge(const VarScope *other) {
  VarScope *l = this;
  const VarScope *r = other;

  while (l) {
    assert(l->depth == r->depth && "Scope corruption");
    assert(l->owner == r->owner && "Scope corruption");

    auto &thisSymbols = l->symbols;
    auto &otherSymbols = r->symbols;
    auto it = otherSymbols.begin();
    auto ie = otherSymbols.end();
    auto te = thisSymbols.end();

    while (it != ie) {
      auto f = thisSymbols.find(it->first);
      if (f != te) {
        if (it->second->info == f->second->info) // lambdas declared on the same line could have same names
          f->second->merge(it->second);
      }
      else {
        it->second->kill(VRS_PARTIALLY);
        thisSymbols[it->first] = it->second;
      }
      ++it;
    }

    l = l->parent;
    r = r->parent;
  }

  evalId = std::max(evalId, other->evalId) + 1;
}